

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::findOrEmitObject(SemanticParser *this,SP *pbrtObject)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  pointer psVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer psVar6;
  pointer psVar7;
  mapped_type *pmVar8;
  element_type *peVar9;
  ostream *poVar10;
  key_type *in_RDX;
  element_type *peVar11;
  SemanticParser *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  pointer psVar13;
  pointer psVar14;
  pointer psVar15;
  element_type *peVar16;
  bool bVar17;
  SP SVar18;
  SP *ourObject;
  SP ourShape;
  SP ourLightSource;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  undefined1 local_68 [32];
  key_type *local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar9 = pbrtObject[0xf].super___shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar9 != (element_type *)0x0) {
    p_Var1 = &pbrtObject[0xe].
              super___shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    peVar2 = (in_RDX->super___shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar11 = (element_type *)p_Var1;
    do {
      bVar17 = *(element_type **)((long)&(peVar9->name).field_2 + 8) < peVar2;
      if (!bVar17) {
        peVar11 = peVar9;
      }
      peVar9 = (element_type *)(&(peVar9->name)._M_string_length)[bVar17];
    } while (peVar9 != (element_type *)0x0);
    if ((peVar11 != (element_type *)p_Var1) &&
       (*(element_type **)((long)&(peVar11->name).field_2 + 8) <= peVar2)) {
      pmVar8 = std::
               map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
               ::operator[]((map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
                             *)(pbrtObject + 0xe),in_RDX);
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (pmVar8->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var5 = (pmVar8->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var5;
      _Var12._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      goto LAB_0013b1c6;
    }
  }
  std::__shared_ptr<pbrt::Object,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::Object>>
            ((__shared_ptr<pbrt::Object,(__gnu_cxx::_Lock_policy)2> *)this,
             (allocator<pbrt::Object> *)local_68);
  pmVar8 = std::
           map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
           ::operator[]((map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
                         *)(pbrtObject + 0xe),in_RDX);
  (pmVar8->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)
       (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar8->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
             &(this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              pixelFilter);
  peVar9 = (in_RDX->super___shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar15 = (peVar9->lightSources).
            super__Vector_base<std::shared_ptr<pbrt::syntactic::LightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::LightSource>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (peVar9->lightSources).
           super__Vector_base<std::shared_ptr<pbrt::syntactic::LightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::LightSource>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = in_RDX;
  if (psVar15 != psVar3) {
    do {
      peVar4 = (psVar15->
               super___shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var5 = (psVar15->
               super___shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_70 = p_Var5;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
            goto LAB_0013ae13;
          }
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
LAB_0013ae13:
      findOrCreateLightSource((SemanticParser *)&stack0xffffffffffffffc0,(SP *)pbrtObject);
      if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
      }
      if (local_40 == (element_type *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"***warning***: could ont parse light source \'",0x2d);
        (**(peVar4->super_Node)._vptr_Node)(local_68,peVar4);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_68._0_8_,local_68._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        if ((element_type *)local_68._0_8_ != (element_type *)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_,(ulong)((long)(_func_int ***)local_68._16_8_ + 1));
        }
      }
      else {
        std::
        vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
        ::push_back((vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
                     *)&((this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->film,(value_type *)&stack0xffffffffffffffc0);
      }
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      psVar15 = psVar15 + 1;
    } while (psVar15 != psVar3);
    peVar9 = (local_48->super___shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  }
  psVar13 = (peVar9->shapes).
            super__Vector_base<std::shared_ptr<pbrt::syntactic::Shape>,_std::allocator<std::shared_ptr<pbrt::syntactic::Shape>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar6 = (peVar9->shapes).
           super__Vector_base<std::shared_ptr<pbrt::syntactic::Shape>,_std::allocator<std::shared_ptr<pbrt::syntactic::Shape>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar13 != psVar6) {
    do {
      p_Var5 = (psVar13->super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_80 = p_Var5;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
            goto LAB_0013af92;
          }
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
LAB_0013af92:
      findOrCreateShape((SemanticParser *)local_68,(SP *)pbrtObject);
      if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
      }
      if ((element_type *)local_68._0_8_ != (element_type *)0x0) {
        std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::
        push_back((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                   *)&((this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->cameras,(value_type *)local_68);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      }
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      psVar13 = psVar13 + 1;
    } while (psVar13 != psVar6);
    peVar9 = (local_48->super___shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  }
  psVar14 = (peVar9->objectInstances).
            super__Vector_base<std::shared_ptr<pbrt::syntactic::Object::Instance>,_std::allocator<std::shared_ptr<pbrt::syntactic::Object::Instance>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (peVar9->objectInstances).
           super__Vector_base<std::shared_ptr<pbrt::syntactic::Object::Instance>,_std::allocator<std::shared_ptr<pbrt::syntactic::Object::Instance>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar14 != psVar7) {
    do {
      p_Var5 = (psVar14->
               super___shared_ptr<pbrt::syntactic::Object::Instance,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        peVar16 = (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_90 = p_Var5;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
          peVar16 = (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
            goto LAB_0013b083;
          }
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          peVar16 = (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
        }
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
LAB_0013b083:
      emitInstance((SemanticParser *)local_68,(SP *)pbrtObject);
      std::vector<std::shared_ptr<pbrt::Instance>,std::allocator<std::shared_ptr<pbrt::Instance>>>::
      emplace_back<std::shared_ptr<pbrt::Instance>>
                ((vector<std::shared_ptr<pbrt::Instance>,std::allocator<std::shared_ptr<pbrt::Instance>>>
                  *)&(peVar16->sampler).
                     super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (shared_ptr<pbrt::Instance> *)local_68);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      }
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
      }
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      psVar14 = psVar14 + 1;
    } while (psVar14 != psVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"created object w/ ",0x12);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," shapes, ",9);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," instances, and ",0x10);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," light sources",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  _Var12._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
LAB_0013b1c6:
  SVar18.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  SVar18.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar18.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Object::SP SemanticParser::findOrEmitObject(pbrt::syntactic::Object::SP pbrtObject)
  {
    if (emittedObjects.find(pbrtObject) != emittedObjects.end()) {
      return emittedObjects[pbrtObject];
    }
      
    Object::SP ourObject = std::make_shared<Object>();
    emittedObjects[pbrtObject] = ourObject;
    ourObject->name = pbrtObject->name;
    
    for (auto lightSource : pbrtObject->lightSources) {
      LightSource::SP ourLightSource = findOrCreateLightSource(lightSource);
      if (ourLightSource)
        ourObject->lightSources.push_back(ourLightSource);
      else
        std::cout << "***warning***: could ont parse light source '" << lightSource->toString() << "'"
                  << std::endl;
    }

    for (auto shape : pbrtObject->shapes) {
      Shape::SP ourShape = findOrCreateShape(shape);
      if (ourShape)
        ourObject->shapes.push_back(ourShape);
    }
    
    for (auto instance : pbrtObject->objectInstances)
      ourObject->instances.push_back(emitInstance(instance));

    std::cout << "created object w/ " << ourObject->shapes.size() << " shapes, "
              << ourObject->instances.size() << " instances, and "
              << ourObject->lightSources.size() << " light sources" << std::endl;
    return ourObject;
  }